

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint64 uVar8;
  bool *pbVar9;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *other;
  byte *pbVar10;
  ulong uVar11;
  long in_RDX;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *in_RSI;
  byte *in_RDI;
  uint b_1;
  uint i_2;
  uint8 *pSelectors;
  int subblock_1;
  uint b;
  int x;
  uint8 *pSelectors1;
  uint8 *pSelectors0;
  uint selector1;
  uint selector0;
  int db;
  int dg;
  int dr;
  uint refinement_error_thresh1;
  uint refinement_error_thresh0;
  uint32 subblock_pixel0_u32;
  color_quad_u8 *pSrc_col;
  uint subblock;
  uint64 trial_error;
  uint use_color4;
  uint flip;
  params params;
  color_quad_u8 subblock_pixels [8];
  uint i_1;
  results results [3];
  uint8 selectors [3] [8];
  uint i;
  results best_results [2];
  uint8 best_selectors [2] [8];
  uint best_use_color4;
  uint best_flip;
  uint64 best_error;
  etc1_optimizer optimizer;
  color_quad_u8 dithered_pixels [16];
  int r;
  uint32 first_pixel_u32;
  color_quad_u8 src_pixel0;
  etc1_block *dst_block;
  color_quad_u8 *pSrc_pixels;
  results *in_stack_fffffffffffffc08;
  etc1_optimizer *in_stack_fffffffffffffc10;
  color_quad_u8 *local_3c0;
  uint32 *local_3a8;
  color_quad_u8 *in_stack_fffffffffffffc68;
  bool *pbVar12;
  etc1_block *in_stack_fffffffffffffc70;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *this;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *paVar13;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *pColor;
  uint in_stack_fffffffffffffc94;
  uint uVar14;
  results *in_stack_fffffffffffffc98;
  int local_35c;
  int local_354;
  uint local_340;
  uint local_33c;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  int local_330;
  uint local_314;
  ulong local_310;
  uint local_308;
  uint local_304;
  int local_300 [2];
  undefined4 local_2f8;
  undefined8 *local_2f0;
  undefined1 local_2e8;
  int *local_2e0;
  undefined4 local_2d8;
  color_quad_u8 cStack_2d4;
  undefined1 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  color_quad_u8 acStack_2a8 [3];
  uint local_29c;
  ulong local_298;
  etc1_optimizer eStack_290;
  uint local_190;
  uint local_18c;
  ulong local_188;
  etc1_optimizer local_180;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 local_88 [16];
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 aaStack_48 [3];
  int local_3c;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 local_38;
  color_quad_u8 local_34;
  byte *local_30;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0 *local_28;
  long local_20;
  uint local_4;
  
  local_30 = in_RDI;
  local_28 = in_RSI;
  local_20 = in_RDX;
  color_quad_u8::color_quad_u8(&local_34,(color_quad_u8 *)in_RSI);
  local_38 = *local_28;
  for (local_3c = 0xf; (0 < local_3c && (local_28[local_3c] == local_38)); local_3c = local_3c + -1)
  {
  }
  if (local_3c == 0) {
    uVar8 = pack_etc1_block_solid_color
                      (in_stack_fffffffffffffc70,(uint8 *)in_stack_fffffffffffffc68);
    local_4 = (uint)(uVar8 << 4);
  }
  else {
    paVar13 = aaStack_48;
    pColor = local_88;
    do {
      this = pColor;
      color_quad_u8::color_quad_u8((color_quad_u8 *)this);
      pColor = this + 1;
    } while (pColor != paVar13);
    if ((*(byte *)(local_20 + 4) & 1) != 0) {
      dither_block_555((color_quad_u8 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      local_28 = local_88;
    }
    etc1_optimizer::etc1_optimizer(in_stack_fffffffffffffc10);
    local_188 = 0xffffffffffffffff;
    local_18c = 0;
    local_190 = 0;
    pbVar9 = (bool *)eStack_290.m_best_selectors;
    pbVar12 = &eStack_290.m_trial_solution.m_valid;
    do {
      etc1_optimizer::results::results((results *)0x22abcf);
      pbVar9 = pbVar9 + 0x28;
    } while (pbVar9 != pbVar12);
    eStack_290.m_selectors[4] = '\0';
    eStack_290.m_selectors[5] = '\0';
    eStack_290.m_selectors[6] = '\0';
    eStack_290.m_selectors[7] = '\0';
    for (; (uint)eStack_290.m_selectors._4_4_ < 2;
        eStack_290.m_selectors._4_4_ = eStack_290.m_selectors._4_4_ + 1) {
      *(undefined4 *)
       &(&eStack_290.m_best_solution)[(uint)eStack_290.m_selectors._4_4_].m_coords.m_color4 = 8;
      *(uint8 **)((&eStack_290.m_best_solution)[(uint)eStack_290.m_selectors._4_4_].m_selectors + 4)
           = eStack_290.m_temp_selectors + (ulong)(uint)eStack_290.m_selectors._4_4_ * 8 + -8;
    }
    local_3a8 = (uint32 *)&local_298;
    do {
      etc1_optimizer::results::results((results *)0x22ac88);
      local_3a8 = local_3a8 + 10;
    } while (local_3a8 != eStack_290.m_sorted_luma[1] + 5);
    for (local_29c = 0; local_29c < 3; local_29c = local_29c + 1) {
      *(undefined4 *)((long)&eStack_290.m_avg_color + (ulong)local_29c * 0x28 + -0xc) = 8;
      *(uint8 **)((long)&eStack_290.m_avg_color + (ulong)local_29c * 0x28 + -4) =
           eStack_290.m_selectors + (ulong)local_29c * 8 + -0x18;
    }
    local_3c0 = (color_quad_u8 *)&local_2c8;
    do {
      color_quad_u8::color_quad_u8(local_3c0);
      local_3c0 = local_3c0 + 1;
    } while (local_3c0 != acStack_2a8);
    etc1_optimizer::params::params
              ((params *)in_stack_fffffffffffffc10,(etc1_pack_params *)in_stack_fffffffffffffc08);
    local_2f8 = 8;
    local_2f0 = &local_2c8;
    for (local_304 = 0; local_304 < 2; local_304 = local_304 + 1) {
      for (local_308 = 0; local_308 < 2; local_308 = local_308 + 1) {
        local_310 = 0;
        for (local_314 = 0; local_314 < 2; local_314 = local_314 + 1) {
          if (local_304 == 0) {
            other = local_28 + (local_314 << 1);
            color_quad_u8::operator=((color_quad_u8 *)&local_2c8,(color_quad_u8 *)other);
            color_quad_u8::operator=
                      ((color_quad_u8 *)((long)&local_2c8 + 4),(color_quad_u8 *)(other + 4));
            color_quad_u8::operator=((color_quad_u8 *)&local_2c0,(color_quad_u8 *)(other + 8));
            color_quad_u8::operator=
                      ((color_quad_u8 *)((long)&local_2c0 + 4),(color_quad_u8 *)(other + 0xc));
            color_quad_u8::operator=((color_quad_u8 *)&local_2b8,(color_quad_u8 *)(other + 1));
            color_quad_u8::operator=
                      ((color_quad_u8 *)((long)&local_2b8 + 4),(color_quad_u8 *)(other + 5));
            color_quad_u8::operator=((color_quad_u8 *)&local_2b0,(color_quad_u8 *)(other + 9));
            color_quad_u8::operator=
                      ((color_quad_u8 *)((long)&local_2b0 + 4),(color_quad_u8 *)(other + 0xd));
          }
          else {
            uVar11 = (ulong)(local_314 << 3);
            local_2c8 = *(undefined8 *)(local_28 + uVar11);
            local_2c0 = *(undefined8 *)(local_28 + uVar11 + 2);
            local_2b8 = *(undefined8 *)(local_28 + uVar11 + 4);
            local_2b0 = *(undefined8 *)(local_28 + uVar11 + 6);
          }
          eStack_290.m_sorted_luma[0][3] = 0xffffffff;
          eStack_290.m_sorted_luma[0][4] = 0xffffffff;
          if ((0 < local_300[0]) && ((local_314 != 0 || (local_308 != 0)))) {
            local_3c = 7;
            while ((0 < local_3c &&
                   ((anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                    ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)
                    ((long)&local_2c8 + (long)local_3c * 4))->m_u32 == local_2c8._0_4_))) {
              local_3c = local_3c + -1;
            }
            if (local_3c == 0) {
              if ((local_314 == 0) || (local_308 != 0)) {
                in_stack_fffffffffffffc10 = (etc1_optimizer *)0x0;
              }
              else {
                in_stack_fffffffffffffc10 = &eStack_290;
              }
              pack_etc1_block_solid_color_constrained
                        (in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,&pColor->r,
                         SUB81((ulong)paVar13 >> 0x38,0),(color_quad_u8 *)this);
            }
          }
          local_2e8 = local_308 != 0;
          local_2d0 = 0;
          if ((local_308 == 0) && (local_314 != 0)) {
            local_2d0 = 1;
            color_quad_u8::operator=(&cStack_2d4,(color_quad_u8 *)&eStack_290);
          }
          if (local_300[0] == 2) {
            local_2d8 = 9;
            local_2e0 = pack_etc1_block::s_scan_delta_0_to_4;
          }
          else if (local_300[0] == 1) {
            local_2d8 = 3;
            local_2e0 = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            local_2d8 = 1;
            local_2e0 = pack_etc1_block::s_scan_delta_0;
          }
          etc1_optimizer::init(&local_180,(EVP_PKEY_CTX *)local_300);
          bVar5 = etc1_optimizer::compute
                            ((etc1_optimizer *)
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          if (!bVar5) break;
          if (0 < local_300[0]) {
            if (3000 < (&local_298)[(ulong)local_314 * 5]) {
              if (local_300[0] == 1) {
                local_2d8 = 4;
                local_2e0 = pack_etc1_block::s_scan_delta_2_to_3;
              }
              else if ((&local_298)[(ulong)local_314 * 5] < 0x1771) {
                local_2d8 = 2;
                local_2e0 = pack_etc1_block::s_scan_delta_5_to_5;
              }
              else {
                local_2d8 = 8;
                local_2e0 = pack_etc1_block::s_scan_delta_5_to_8;
              }
              bVar5 = etc1_optimizer::compute
                                ((etc1_optimizer *)
                                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
              if (!bVar5) break;
            }
            if ((ulong)eStack_290.m_sorted_luma[0]._12_8_ < (&local_298)[(ulong)local_314 * 5]) {
              etc1_optimizer::results::operator=
                        ((results *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
            }
          }
          local_310 = (&local_298)[(ulong)local_314 * 5] + local_310;
          if (local_188 <= local_310) break;
        }
        if (1 < local_314) {
          local_188 = local_310;
          etc1_optimizer::results::operator=
                    ((results *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          etc1_optimizer::results::operator=
                    ((results *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          local_18c = local_304;
          local_190 = local_308;
        }
      }
    }
    local_330 = (uint)eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.r -
                (uint)eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r;
    iVar6 = (uint)eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.g -
            (uint)eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.g;
    iVar7 = (uint)eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.b -
            (uint)eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.b;
    if (local_190 == 0) {
      if (local_330 < 0) {
        local_330 = local_330 + 8;
      }
      *local_30 = eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r << 3 |
                  (byte)local_330;
      if (iVar6 < 0) {
        iVar6 = iVar6 + 8;
      }
      local_30[1] = eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.g << 3 |
                    (byte)iVar6;
      if (iVar7 < 0) {
        iVar7 = iVar7 + 8;
      }
      local_30[2] = eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.b << 3 |
                    (byte)iVar7;
    }
    else {
      *local_30 = eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.r |
                  eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r << 4;
      local_30[1] = eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.g |
                    eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.g << 4;
      local_30[2] = eStack_290.m_trial_solution.m_coords.m_unscaled_color.field_0.field_0.b |
                    eStack_290.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.b << 4;
    }
    local_30[3] = (byte)(eStack_290.m_trial_solution.m_coords.m_inten_table << 2) |
                  (byte)(eStack_290.m_best_solution.m_coords.m_inten_table << 5) |
                  (byte)(((local_190 ^ 0xffffffff) & 1) << 1) | (byte)local_18c;
    local_33c = 0;
    local_340 = 0;
    if (local_18c == 0) {
      local_35c = 1;
      while( true ) {
        if (local_35c < 0) break;
        pbVar10 = (byte *)(*(long *)((&eStack_290.m_best_solution)[local_35c].m_selectors + 4) + 4);
        for (uVar14 = 0; uVar14 < 2; uVar14 = uVar14 + 1) {
          local_33c = (((local_33c << 1 |
                        *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[3]) & 1) << 1 |
                       *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[2]) & 1) << 1 |
                      *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[1]) & 1) << 1 |
                      *(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar10) & 1;
          local_340 = (((local_340 << 1 |
                        (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[3]) >> 1))
                        << 1 | (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[2])
                                     >> 1)) << 1 |
                      (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar10[1]) >> 1))
                      << 1 | (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar10) >>
                                   1);
          pbVar10 = pbVar10 + -4;
        }
        local_35c = local_35c + -1;
      }
    }
    else {
      local_354 = 3;
      while( true ) {
        if (local_354 < 0) break;
        bVar1 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(eStack_290.m_trial_solution._16_8_ + (long)(local_354 + 4)
                                         ));
        bVar2 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(eStack_290.m_trial_solution._16_8_ + (long)local_354));
        bVar3 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(eStack_290.m_best_solution._16_8_ + (long)(local_354 + 4))
                         );
        bVar4 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(eStack_290.m_best_solution._16_8_ + (long)local_354));
        local_33c = (((local_33c << 1 | bVar1 & 1) << 1 | bVar2 & 1) << 1 | bVar3 & 1) << 1 |
                    bVar4 & 1;
        local_340 = (((local_340 << 1 | (uint)(bVar1 >> 1)) << 1 | (uint)(bVar2 >> 1)) << 1 |
                    (uint)(bVar3 >> 1)) << 1 | (uint)(bVar4 >> 1);
        local_354 = local_354 + -1;
      }
    }
    local_30[4] = (byte)((ushort)(undefined2)local_340 >> 8);
    local_30[5] = (byte)(undefined2)local_340;
    local_30[6] = (byte)((ushort)(undefined2)local_33c >> 8);
    local_30[7] = (byte)(undefined2)local_33c;
    local_4 = (uint)local_188;
  }
  return local_4;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params) {
  const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
  etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

  color_quad_u8 src_pixel0(pSrc_pixels[0]);

  // Check for solid block.
  const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
  int r;
  for (r = 15; r >= 1; --r)
    if (pSrc_pixels[r].m_u32 != first_pixel_u32)
      break;
  if (!r)
    return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));

  color_quad_u8 dithered_pixels[16];
  if (pack_params.m_dithering) {
    dither_block_555(dithered_pixels, pSrc_pixels);
    pSrc_pixels = dithered_pixels;
  }

  etc1_optimizer optimizer;

  uint64 best_error = cUINT64_MAX;
  uint best_flip = false, best_use_color4 = false;

  uint8 best_selectors[2][8];
  etc1_optimizer::results best_results[2];
  for (uint i = 0; i < 2; i++) {
    best_results[i].m_n = 8;
    best_results[i].m_pSelectors = best_selectors[i];
  }

  uint8 selectors[3][8];
  etc1_optimizer::results results[3];

  for (uint i = 0; i < 3; i++) {
    results[i].m_n = 8;
    results[i].m_pSelectors = selectors[i];
  }

  color_quad_u8 subblock_pixels[8];

  etc1_optimizer::params params(pack_params);
  params.m_num_src_pixels = 8;
  params.m_pSrc_pixels = subblock_pixels;

  for (uint flip = 0; flip < 2; flip++) {
    for (uint use_color4 = 0; use_color4 < 2; use_color4++) {
      uint64 trial_error = 0;

      uint subblock;
      for (subblock = 0; subblock < 2; subblock++) {
        if (flip)
          memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
        else {
          const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
          subblock_pixels[0] = pSrc_col[0];
          subblock_pixels[1] = pSrc_col[4];
          subblock_pixels[2] = pSrc_col[8];
          subblock_pixels[3] = pSrc_col[12];
          subblock_pixels[4] = pSrc_col[1];
          subblock_pixels[5] = pSrc_col[5];
          subblock_pixels[6] = pSrc_col[9];
          subblock_pixels[7] = pSrc_col[13];
        }

        results[2].m_error = cUINT64_MAX;
        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4))) {
          const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
          for (r = 7; r >= 1; --r)
            if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
              break;
          if (!r) {
            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : NULL);
          }
        }

        params.m_use_color4 = (use_color4 != 0);
        params.m_constrain_against_base_color5 = false;

        if ((!use_color4) && (subblock)) {
          params.m_constrain_against_base_color5 = true;
          params.m_base_color5 = results[0].m_block_color_unscaled;
        }

        if (params.m_quality == cHighQuality) {
          static const int s_scan_delta_0_to_4[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
          params.m_pScan_deltas = s_scan_delta_0_to_4;
        } else if (params.m_quality == cMediumQuality) {
          static const int s_scan_delta_0_to_1[] = {-1, 0, 1};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
          params.m_pScan_deltas = s_scan_delta_0_to_1;
        } else {
          static const int s_scan_delta_0[] = {0};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
          params.m_pScan_deltas = s_scan_delta_0;
        }

        optimizer.init(params, results[subblock]);
        if (!optimizer.compute())
          break;

        if (params.m_quality >= cMediumQuality) {
          // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
          const uint refinement_error_thresh0 = 3000;
          const uint refinement_error_thresh1 = 6000;
          if (results[subblock].m_error > refinement_error_thresh0) {
            if (params.m_quality == cMediumQuality) {
              static const int s_scan_delta_2_to_3[] = {-3, -2, 2, 3};
              params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
              params.m_pScan_deltas = s_scan_delta_2_to_3;
            } else {
              static const int s_scan_delta_5_to_5[] = {-5, 5};
              static const int s_scan_delta_5_to_8[] = {-8, -7, -6, -5, 5, 6, 7, 8};
              if (results[subblock].m_error > refinement_error_thresh1) {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                params.m_pScan_deltas = s_scan_delta_5_to_8;
              } else {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                params.m_pScan_deltas = s_scan_delta_5_to_5;
              }
            }

            if (!optimizer.compute())
              break;
          }

          if (results[2].m_error < results[subblock].m_error)
            results[subblock] = results[2];
        }

        trial_error += results[subblock].m_error;
        if (trial_error >= best_error)
          break;
      }

      if (subblock < 2)
        continue;

      best_error = trial_error;
      best_results[0] = results[0];
      best_results[1] = results[1];
      best_flip = flip;
      best_use_color4 = use_color4;

    }  // use_color4

  }  // flip

  int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
  int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
  int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
  RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

  if (best_use_color4) {
    dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
    dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
    dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
  } else {
    if (dr < 0)
      dr += 8;
    dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
    if (dg < 0)
      dg += 8;
    dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
    if (db < 0)
      db += 8;
    dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
  }

  dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

  uint selector0 = 0, selector1 = 0;
  if (best_flip) {
    // flipped:
    // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
    // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
    //
    // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
    // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
    const uint8* pSelectors0 = best_results[0].m_pSelectors;
    const uint8* pSelectors1 = best_results[1].m_pSelectors;
    for (int x = 3; x >= 0; --x) {
      uint b;
      b = g_selector_index_to_etc1[pSelectors1[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors1[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);
    }
  } else {
    // non-flipped:
    // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
    // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
    //
    // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
    // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
    for (int subblock = 1; subblock >= 0; --subblock) {
      const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
      for (uint i = 0; i < 2; i++) {
        uint b;
        b = g_selector_index_to_etc1[pSelectors[3]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[2]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[1]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[0]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        pSelectors -= 4;
      }
    }
  }

  dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
  dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
  dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
  dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

  return static_cast<unsigned int>(best_error);
}